

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

Time absl::lts_20250127::FromUniversal(int64_t universal)

{
  undefined8 in_RCX;
  uint32_t extraout_var;
  Duration DVar1;
  Duration rhs;
  
  DVar1 = time_internal::FromInt64<1000000000l>();
  rhs.rep_hi_.lo_ = DVar1.rep_lo_;
  rhs.rep_hi_.hi_ = extraout_var;
  rhs.rep_lo_ = (uint32_t)in_RCX;
  DVar1 = operator*((lts_20250127 *)0x64,DVar1.rep_hi_.lo_,rhs);
  DVar1 = (Duration)operator+((Time)ZEXT812(0xfffffff1886e0900),DVar1);
  return (Time)DVar1;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}